

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_create(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  AREA_DATA *pAVar2;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  AREA_DATA_conflict *pArea;
  
  iVar1 = get_security(in_RDI);
  if (iVar1 < 9) {
    send_to_char((char *)in_RDI,in_RSI);
  }
  else {
    pAVar2 = new_area();
    area_last->next = pAVar2;
    area_last = pAVar2;
    in_RDI->desc->pEdit = pAVar2;
    _Var3 = std::pow<int,int>(0,0x77bda7);
    pAVar2->area_flags[0] = (long)_Var3 | pAVar2->area_flags[0];
    send_to_char((char *)in_RDI,in_RSI);
  }
  return false;
}

Assistant:

bool aedit_create(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;

	if (get_security(ch) < 9)
	{
		send_to_char("You do not have the security to do that.\n\r", ch);
		return false;
	}

	pArea = new_area();
	area_last->next = pArea;
	area_last = pArea; /* Thanks, Walker. */
	ch->desc->pEdit = (void *)pArea;

	SET_BIT(pArea->area_flags, AREA_ADDED);
	send_to_char("Area Created.\n\r", ch);
	return false;
}